

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O0

Vec_Ptr_t * Nwk_ManDfs(Nwk_Man_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Nwk_Obj_t *p;
  int local_24;
  int i;
  Nwk_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Nwk_Man_t *pNtk_local;
  
  Nwk_ManIncrementTravId(pNtk);
  vNodes_00 = Vec_PtrAlloc(100);
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    p = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,local_24);
    if (p != (Nwk_Obj_t *)0x0) {
      iVar1 = Nwk_ObjIsCi(p);
      if (iVar1 == 0) {
        iVar1 = Nwk_ObjIsCo(p);
        if (iVar1 != 0) {
          Nwk_ManDfs_rec(p,vNodes_00);
        }
      }
      else {
        Nwk_ObjSetTravIdCurrent(p);
        Vec_PtrPush(vNodes_00,p);
      }
    }
  }
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Nwk_ManDfs( Nwk_Man_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Nwk_Obj_t * pObj;
    int i;
    Nwk_ManIncrementTravId( pNtk );
    vNodes = Vec_PtrAlloc( 100 );
    Nwk_ManForEachObj( pNtk, pObj, i )
    {
        if ( Nwk_ObjIsCi(pObj) )
        {
            Nwk_ObjSetTravIdCurrent( pObj );
            Vec_PtrPush( vNodes, pObj );
        }
        else if ( Nwk_ObjIsCo(pObj) )
            Nwk_ManDfs_rec( pObj, vNodes );
    }
    return vNodes;
}